

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findDeclaredFunctions.cpp
# Opt level: O1

void findDeclaredFunctions(Module *module,Program *program)

{
  char cVar1;
  int iVar2;
  long lVar3;
  Function *llvmFunc;
  Module *pMVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  pMVar4 = *(Module **)(module + 0x20);
  if (pMVar4 != module + 0x18) {
    do {
      llvmFunc = (Function *)(pMVar4 + -0x38);
      if (pMVar4 == (Module *)0x0) {
        llvmFunc = (Function *)0x0;
      }
      if (((byte)llvmFunc[0x17] & 0x10) != 0) {
        cVar1 = llvm::GlobalValue::isDeclaration();
        if ((cVar1 != '\0') || ((*(uint *)(llvmFunc + 0x20) & 0xf) == 7)) {
          auVar6 = llvm::Value::getName();
          lVar3 = auVar6._0_8_;
          if (lVar3 == 0) {
            local_70 = &local_60;
            local_68 = 0;
            local_60 = 0;
          }
          else {
            local_70 = &local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,lVar3,auVar6._8_8_ + lVar3);
          }
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          if (iVar2 == 0) {
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (local_70 != &local_60) {
              operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
            }
          }
          else {
            auVar6 = llvm::Value::getName();
            bVar5 = true;
            if (auVar6._8_8_ == 5) {
              bVar5 = (char)auVar6._0_8_[1] != 'n' || *auVar6._0_8_ != 0x616e7369;
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (local_70 != &local_60) {
              operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
            }
            if (bVar5) {
              bVar5 = Program::isFunctionDeclared(program,llvmFunc);
              if (!bVar5) {
                declareFunc(llvmFunc,program);
              }
            }
          }
        }
        cVar1 = llvm::GlobalValue::isDeclaration();
        if (cVar1 == '\0') {
          bVar5 = Program::isFunctionDeclared(program,llvmFunc);
          if (!bVar5) {
            declareFunc(llvmFunc,program);
          }
        }
      }
      pMVar4 = *(Module **)(pMVar4 + 8);
    } while (pMVar4 != module + 0x18);
  }
  Program::addPass(program,FindDeclaredFunctions);
  return;
}

Assistant:

void findDeclaredFunctions(const llvm::Module *module, Program& program) {
    for(const llvm::Function& func : module->functions()) {
        if (func.hasName()) {
            if (func.isDeclaration() || llvm::Function::isInternalLinkage(func.getLinkage())) {
                if (func.getName().str().substr(0, 8) != "llvm.dbg" && func.getName() != "isnan") {
                    if (!program.isFunctionDeclared(&func)) {
                        declareFunc(&func, program);
                    }
                }
            }

            if (!func.isDeclaration()) {
                if (!program.isFunctionDeclared(&func)) {
                    declareFunc(&func, program);
                }
            }
        }
    }

    program.addPass(PassType::FindDeclaredFunctions);
}